

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

bool __thiscall Jinx::Impl::Parser::CheckBinaryOperator(Parser *this)

{
  SymbolType SVar1;
  pointer pSVar2;
  byte bVar3;
  
  if (((this->m_error == false) &&
      (pSVar2 = (this->m_currentSymbol)._M_current,
      pSVar2 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (SVar1 = pSVar2->type, SVar1 < Over))
  {
    bVar3 = (byte)(0x8000001f007f00 >> ((byte)SVar1 & 0x3f));
  }
  else {
    bVar3 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

inline_t bool Parser::CheckBinaryOperator() const
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return false;
		auto type = m_currentSymbol->type;
		return
			type == SymbolType::And ||
			type == SymbolType::Asterisk ||
			type == SymbolType::Equals ||
			type == SymbolType::NotEquals ||
			type == SymbolType::ForwardSlash ||
			type == SymbolType::GreaterThan ||
			type == SymbolType::GreaterThanEquals ||
			type == SymbolType::LessThan ||
			type == SymbolType::LessThanEquals ||
			type == SymbolType::Minus ||
			type == SymbolType::Or ||
			type == SymbolType::Percent ||
			type == SymbolType::Plus;
	}